

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

siginfo_t * kj::toRegularSiginfo(siginfo_t *__return_storage_ptr__,signalfd_siginfo *siginfo)

{
  int iVar1;
  undefined4 uVar2;
  siginfo_t *result;
  signalfd_siginfo *siginfo_local;
  
  memset(__return_storage_ptr__,0,0x80);
  __return_storage_ptr__->si_signo = siginfo->ssi_signo;
  __return_storage_ptr__->si_errno = siginfo->ssi_errno;
  __return_storage_ptr__->si_code = siginfo->ssi_code;
  if (0 < siginfo->ssi_code) {
    switch(siginfo->ssi_signo) {
    case 4:
    case 5:
    case 7:
    case 8:
    case 0xb:
      uVar2 = *(undefined4 *)((long)&siginfo->ssi_addr + 4);
      *(__pid_t *)&__return_storage_ptr__->_sifields = *(undefined4 *)&siginfo->ssi_addr;
      *(undefined4 *)((long)&__return_storage_ptr__->_sifields + 4) = uVar2;
      (__return_storage_ptr__->_sifields)._sigfault.si_addr_lsb = siginfo->ssi_addr_lsb;
      break;
    case 0x11:
      (__return_storage_ptr__->_sifields)._pad[0] = siginfo->ssi_pid;
      (__return_storage_ptr__->_sifields)._pad[1] = siginfo->ssi_uid;
      (__return_storage_ptr__->_sifields)._pad[2] = siginfo->ssi_status;
      (__return_storage_ptr__->_sifields)._sigchld.si_utime = siginfo->ssi_utime;
      (__return_storage_ptr__->_sifields)._sigchld.si_stime = siginfo->ssi_stime;
      break;
    case 0x1d:
      *(ulong *)&__return_storage_ptr__->_sifields = (ulong)siginfo->ssi_band;
      (__return_storage_ptr__->_sifields)._pad[2] = siginfo->ssi_fd;
      break;
    case 0x1f:
    }
    return __return_storage_ptr__;
  }
  iVar1 = siginfo->ssi_code;
  if (iVar1 == -6) {
LAB_005509a4:
    (__return_storage_ptr__->_sifields)._pad[0] = siginfo->ssi_pid;
    (__return_storage_ptr__->_sifields)._pad[1] = siginfo->ssi_uid;
  }
  else {
    if (1 < iVar1 + 4U) {
      if (iVar1 == -2) {
        (__return_storage_ptr__->_sifields)._pad[0] = siginfo->ssi_tid;
        (__return_storage_ptr__->_sifields)._pad[1] = siginfo->ssi_overrun;
        (__return_storage_ptr__->_sifields)._timer.si_sigval = (__sigval_t)siginfo->ssi_ptr;
        return __return_storage_ptr__;
      }
      if ((iVar1 != -1) && (iVar1 == 0)) goto LAB_005509a4;
    }
    (__return_storage_ptr__->_sifields)._pad[0] = siginfo->ssi_pid;
    (__return_storage_ptr__->_sifields)._pad[1] = siginfo->ssi_uid;
    (__return_storage_ptr__->_sifields)._timer.si_sigval = (__sigval_t)siginfo->ssi_ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

static siginfo_t toRegularSiginfo(const struct signalfd_siginfo& siginfo) {
  // Unfortunately, siginfo_t is mostly a big union and the correct set of fields to fill in
  // depends on the type of signal. OTOH, signalfd_siginfo is a flat struct that expands all
  // siginfo_t's union fields out to be non-overlapping. We can't just copy all the fields over
  // because of the unions; we have to carefully figure out which fields are appropriate to fill
  // in for this signal. Ick.

  siginfo_t result;
  memset(&result, 0, sizeof(result));

  result.si_signo = siginfo.ssi_signo;
  result.si_errno = siginfo.ssi_errno;
  result.si_code = siginfo.ssi_code;

  if (siginfo.ssi_code > 0) {
    // Signal originated from the kernel. The structure of the siginfo depends primarily on the
    // signal number.

    switch (siginfo.ssi_signo) {
    case SIGCHLD:
      result.si_pid = siginfo.ssi_pid;
      result.si_uid = siginfo.ssi_uid;
      result.si_status = siginfo.ssi_status;
      result.si_utime = siginfo.ssi_utime;
      result.si_stime = siginfo.ssi_stime;
      break;

    case SIGILL:
    case SIGFPE:
    case SIGSEGV:
    case SIGBUS:
    case SIGTRAP:
      result.si_addr = reinterpret_cast<void*>(static_cast<uintptr_t>(siginfo.ssi_addr));
#ifdef si_trapno
      result.si_trapno = siginfo.ssi_trapno;
#endif
#ifdef si_addr_lsb
      // ssi_addr_lsb is defined as coming immediately after ssi_addr in the kernel headers but
      // apparently the userspace headers were never updated. So we do a pointer hack. :(
      result.si_addr_lsb = *reinterpret_cast<const uint16_t*>(&siginfo.ssi_addr + 1);
#endif
      break;

    case SIGIO:
      static_assert(SIGIO == SIGPOLL, "SIGIO != SIGPOLL?");

      // Note: Technically, code can arrange for SIGIO signals to be delivered with a signal number
      //   other than SIGIO. AFAICT there is no way for us to detect this in the siginfo. Luckily
      //   SIGIO is totally obsoleted by epoll so it shouldn't come up.

      result.si_band = siginfo.ssi_band;
      result.si_fd = siginfo.ssi_fd;
      break;

    case SIGSYS:
      // Apparently SIGSYS's fields are not available in signalfd_siginfo?
      break;
    }

  } else {
    // Signal originated from userspace. The sender could specify whatever signal number they
    // wanted. The structure of the signal is determined by the API they used, which is identified
    // by SI_CODE.

    switch (siginfo.ssi_code) {
      case SI_USER:
      case SI_TKILL:
        // kill(), tkill(), or tgkill().
        result.si_pid = siginfo.ssi_pid;
        result.si_uid = siginfo.ssi_uid;
        break;

      case SI_QUEUE:
      case SI_MESGQ:
      case SI_ASYNCIO:
      default:
        result.si_pid = siginfo.ssi_pid;
        result.si_uid = siginfo.ssi_uid;

        // This is awkward. In siginfo_t, si_ptr and si_int are in a union together. In
        // signalfd_siginfo, they are not. We don't really know whether the app intended to send
        // an int or a pointer. Presumably since the pointer is always larger than the int, if
        // we write the pointer, we'll end up with the right value for the int? Presumably the
        // two fields of signalfd_siginfo are actually extracted from one of these unions
        // originally, so actually contain redundant data? Better write some tests...
        //
        // Making matters even stranger, siginfo.ssi_ptr is 64-bit even on 32-bit systems, and
        // it appears that instead of doing the obvious thing by casting the pointer value to
        // 64 bits, the kernel actually memcpy()s the 32-bit value into the 64-bit space. As
        // a result, on big-endian 32-bit systems, the original pointer value ends up in the
        // *upper* 32 bits of siginfo.ssi_ptr, which is totally weird. We play along and use
        // a memcpy() on our end too, to get the right result on all platforms.
        memcpy(&result.si_ptr, &siginfo.ssi_ptr, sizeof(result.si_ptr));
        break;

      case SI_TIMER:
        result.si_timerid = siginfo.ssi_tid;
        result.si_overrun = siginfo.ssi_overrun;

        // Again with this weirdness...
        result.si_ptr = reinterpret_cast<void*>(static_cast<uintptr_t>(siginfo.ssi_ptr));
        break;
    }
  }

  return result;
}